

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

void Am_TEMP_Register_Prototype(char *name,Am_Object *proto)

{
  Am_Wrapper *pAVar1;
  Am_Value local_30;
  Am_Assoc local_20;
  Am_Object *local_18;
  Am_Object *proto_local;
  char *name_local;
  
  local_18 = proto;
  proto_local = (Am_Object *)name;
  Am_Value::Am_Value(&local_30,name);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(local_18);
  Am_Assoc::Am_Assoc(&local_20,&local_30,pAVar1);
  pAVar1 = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_20);
  Am_Value_List::Add(&am_all_proto_names,pAVar1,Am_TAIL,true);
  Am_Assoc::~Am_Assoc(&local_20);
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

void
Am_TEMP_Register_Prototype(const char *name, Am_Object &proto)
{
  am_all_proto_names.Add(Am_Assoc(name, proto));
}